

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

int main(void)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  void *__ptr;
  long lVar5;
  int in_ECX;
  undefined4 in_register_0000000c;
  int in_EDX;
  int sock;
  int sock_00;
  int family;
  int sock_01;
  int family_00;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int family_04;
  int sock_11;
  int family_05;
  int sock_12;
  int family_06;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  int family_07;
  int sock_17;
  int family_08;
  int sock_18;
  int family_09;
  int sock_19;
  int sock_20;
  int sock_21;
  int sock_22;
  int in_ESI;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  short sVar10;
  short sVar11;
  short sVar13;
  short sVar15;
  short sVar17;
  short sVar19;
  short sVar21;
  short sVar23;
  short sVar25;
  short sVar26;
  short sVar28;
  short sVar30;
  short sVar32;
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar12;
  short sVar14;
  short sVar16;
  short sVar18;
  short sVar20;
  short sVar22;
  short sVar24;
  short sVar27;
  short sVar29;
  short sVar31;
  short sVar33;
  short sVar35;
  short sVar37;
  short sVar39;
  
  iVar3 = test_socket_impl((char *)0x2d,in_ESI,in_EDX,in_ECX);
  test_connect_impl((char *)0x2e,iVar3,sock,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x2f,iVar3,sock_00);
  iVar4 = test_socket_impl((char *)0x32,iVar3,family,in_ECX);
  iVar3 = iVar4;
  test_connect_impl((char *)0x33,iVar4,sock_01,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(200);
  iVar3 = test_socket_impl((char *)0x38,iVar3,family_00,in_ECX);
  test_bind_impl((char *)0x39,iVar3,sock_02,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_send_impl((char *)0x3d,iVar4,0x102181,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x3e,iVar3,0x102181,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_send_impl((char *)0x3f,iVar3,0x102181,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x40,iVar4,0x102181,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar6 = 100;
  do {
    test_send_impl((char *)0x45,iVar4,0x1021aa,(char *)CONCAT44(in_register_0000000c,in_ECX));
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 100;
  do {
    test_recv_impl((char *)0x48,iVar3,0x1021aa,(char *)CONCAT44(in_register_0000000c,in_ECX));
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  __ptr = malloc(10000);
  auVar2 = _DAT_00102030;
  lVar5 = 0;
  auVar7 = _DAT_00102010;
  auVar8 = _DAT_00102020;
  do {
    auVar9 = pmulhuw(auVar8,auVar2);
    sVar10 = auVar8._0_2_ + (auVar9._0_2_ >> 3) * -10;
    sVar12 = auVar8._2_2_;
    sVar11 = sVar12 + (auVar9._2_2_ >> 3) * -10;
    sVar14 = auVar8._4_2_;
    sVar13 = sVar14 + (auVar9._4_2_ >> 3) * -10;
    sVar16 = auVar8._6_2_;
    sVar15 = sVar16 + (auVar9._6_2_ >> 3) * -10;
    sVar18 = auVar8._8_2_;
    sVar17 = sVar18 + (auVar9._8_2_ >> 3) * -10;
    sVar20 = auVar8._10_2_;
    sVar19 = sVar20 + (auVar9._10_2_ >> 3) * -10;
    sVar22 = auVar8._12_2_;
    sVar24 = auVar8._14_2_;
    sVar21 = sVar22 + (auVar9._12_2_ >> 3) * -10;
    sVar23 = sVar24 + (auVar9._14_2_ >> 3) * -10;
    auVar9 = pmulhuw(auVar7,auVar2);
    sVar25 = auVar7._0_2_ + (auVar9._0_2_ >> 3) * -10;
    sVar27 = auVar7._2_2_;
    sVar26 = sVar27 + (auVar9._2_2_ >> 3) * -10;
    sVar29 = auVar7._4_2_;
    sVar28 = sVar29 + (auVar9._4_2_ >> 3) * -10;
    sVar31 = auVar7._6_2_;
    sVar30 = sVar31 + (auVar9._6_2_ >> 3) * -10;
    sVar33 = auVar7._8_2_;
    sVar32 = sVar33 + (auVar9._8_2_ >> 3) * -10;
    sVar35 = auVar7._10_2_;
    sVar34 = sVar35 + (auVar9._10_2_ >> 3) * -10;
    sVar37 = auVar7._12_2_;
    sVar39 = auVar7._14_2_;
    sVar36 = sVar37 + (auVar9._12_2_ >> 3) * -10;
    sVar38 = sVar39 + (auVar9._14_2_ >> 3) * -10;
    pbVar1 = (byte *)((long)__ptr + lVar5);
    *pbVar1 = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10) | 0x30;
    pbVar1[1] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11) | 0x30;
    pbVar1[2] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13) | 0x30;
    pbVar1[3] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15) | 0x30;
    pbVar1[4] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17) | 0x30;
    pbVar1[5] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19) | 0x30;
    pbVar1[6] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21) | 0x30;
    pbVar1[7] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23) | 0x30;
    pbVar1[8] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25) | 0x30;
    pbVar1[9] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26) | 0x30;
    pbVar1[10] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28) | 0x30;
    pbVar1[0xb] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30) | 0x30;
    pbVar1[0xc] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32) | 0x30;
    pbVar1[0xd] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34) | 0x30;
    pbVar1[0xe] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36) | 0x30;
    pbVar1[0xf] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38) | 0x30;
    lVar5 = lVar5 + 0x10;
    auVar8._0_2_ = auVar8._0_2_ + 0x10;
    auVar8._2_2_ = sVar12 + 0x10;
    auVar8._4_2_ = sVar14 + 0x10;
    auVar8._6_2_ = sVar16 + 0x10;
    auVar8._8_2_ = sVar18 + 0x10;
    auVar8._10_2_ = sVar20 + 0x10;
    auVar8._12_2_ = sVar22 + 0x10;
    auVar8._14_2_ = sVar24 + 0x10;
    auVar7._0_2_ = auVar7._0_2_ + 0x10;
    auVar7._2_2_ = sVar27 + 0x10;
    auVar7._4_2_ = sVar29 + 0x10;
    auVar7._6_2_ = sVar31 + 0x10;
    auVar7._8_2_ = sVar33 + 0x10;
    auVar7._10_2_ = sVar35 + 0x10;
    auVar7._12_2_ = sVar37 + 0x10;
    auVar7._14_2_ = sVar39 + 0x10;
  } while (lVar5 != 10000);
  *(undefined1 *)((long)__ptr + 9999) = 0;
  test_send_impl((char *)0x52,iVar4,(int)__ptr,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x53,iVar3,(int)__ptr,(char *)CONCAT44(in_register_0000000c,in_ECX));
  free(__ptr);
  test_close_impl((char *)0x56,iVar4,sock_03);
  test_close_impl((char *)0x57,iVar3,sock_04);
  iVar4 = test_socket_impl((char *)0x5a,iVar3,family_01,in_ECX);
  iVar3 = iVar4;
  test_bind_impl((char *)0x5b,iVar4,sock_05,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar6 = test_socket_impl((char *)0x5c,iVar3,family_02,in_ECX);
  iVar3 = iVar6;
  test_connect_impl((char *)0x5d,iVar6,sock_06,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar3 = test_socket_impl((char *)0x5e,iVar3,family_03,in_ECX);
  test_connect_impl((char *)0x5f,iVar3,sock_07,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(100);
  test_close_impl((char *)0x61,iVar3,sock_08);
  test_close_impl((char *)0x62,iVar6,sock_09);
  test_close_impl((char *)0x63,iVar4,sock_10);
  iVar4 = test_socket_impl((char *)0x66,iVar4,family_04,in_ECX);
  iVar3 = iVar4;
  test_bind_impl((char *)0x67,iVar4,sock_11,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar6 = test_socket_impl((char *)0x68,iVar3,family_05,in_ECX);
  iVar3 = iVar6;
  test_bind_impl((char *)0x69,iVar6,sock_12,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar3 = test_socket_impl((char *)0x6a,iVar3,family_06,in_ECX);
  test_connect_impl((char *)0x6b,iVar3,sock_13,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(100);
  test_send_impl((char *)0x6d,iVar4,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x6e,iVar3,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x6f,iVar4,sock_14);
  test_send_impl((char *)0x70,iVar6,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x71,iVar3,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x72,iVar3,sock_15);
  test_close_impl((char *)0x73,iVar6,sock_16);
  iVar4 = test_socket_impl((char *)0x76,iVar6,family_07,in_ECX);
  iVar3 = iVar4;
  test_bind_impl((char *)0x77,iVar4,sock_17,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(100);
  iVar6 = test_socket_impl((char *)0x79,iVar3,family_08,in_ECX);
  iVar3 = iVar6;
  test_bind_impl((char *)0x7a,iVar6,sock_18,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar3 = test_socket_impl((char *)0x7b,iVar3,family_09,in_ECX);
  test_connect_impl((char *)0x7c,iVar3,sock_19,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(100);
  test_send_impl((char *)0x7e,iVar4,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x7f,iVar3,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x80,iVar6,sock_20);
  test_send_impl((char *)0x81,iVar4,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x82,iVar3,0x1021ae,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x83,iVar4,sock_21);
  test_close_impl((char *)0x84,iVar3,sock_22);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int sc;
    int i;
    int s1, s2;

    int size;
    char * buf;

    /*  Try closing a IPC socket while it not connected. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Leave enough time for at least one re-connect attempt. */
    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 1; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
        test_recv (sb, "0123456789012345678901234567890123456789");
        test_send (sb, "0123456789012345678901234567890123456789");
        test_recv (sc, "0123456789012345678901234567890123456789");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    /*  Send something large enough to trigger overlapped I/O on Windows. */
    size = 10000;
    buf = malloc (size);
    for (i = 0; i < size; ++i) {
        buf[i] = 48 + i % 10;
    }
    buf[size-1] = '\0';
    test_send (sc, buf);
    test_recv (sb, buf);
    free (buf);

    test_close (sc);
    test_close (sb);

    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_send (s1, "ABC");
    test_recv (sc, "ABC");   
    test_close (sc);
    test_close (s1);

    /*  Test closing a socket that is waiting to bind. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    nn_sleep (100);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (s1);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_close (sc);

    return 0;
}